

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EntityDestinationRecord.cpp
# Opt level: O0

KBOOL __thiscall
KDIS::DATA_TYPE::EntityDestinationRecord::operator==
          (EntityDestinationRecord *this,EntityDestinationRecord *Value)

{
  KBOOL KVar1;
  EntityDestinationRecord *Value_local;
  EntityDestinationRecord *this_local;
  
  KVar1 = EntityIdentifier::operator!=(&this->m_Entity,&Value->m_Entity);
  if (KVar1) {
    this_local._7_1_ = false;
  }
  else if (this->m_ui16DstCommsDvcID == Value->m_ui16DstCommsDvcID) {
    if (this->m_ui8DstLineID == Value->m_ui8DstLineID) {
      if (this->m_ui8DstPriority == Value->m_ui8DstPriority) {
        if (this->m_ui8LnStCmd == Value->m_ui8LnStCmd) {
          this_local._7_1_ = true;
        }
        else {
          this_local._7_1_ = false;
        }
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

KBOOL EntityDestinationRecord::operator == ( const EntityDestinationRecord & Value ) const
{
    if( m_Entity            != Value.m_Entity )             return false;
    if( m_ui16DstCommsDvcID != Value.m_ui16DstCommsDvcID )  return false;
    if( m_ui8DstLineID      != Value.m_ui8DstLineID )       return false;
    if( m_ui8DstPriority    != Value.m_ui8DstPriority )     return false;
    if( m_ui8LnStCmd        != Value.m_ui8LnStCmd )         return false;
    return true;
}